

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O3

optional<bool> __thiscall tinyusdz::primvar::PrimVar::get_value<bool>(PrimVar *this)

{
  int iVar1;
  long in_RSI;
  bool bVar2;
  undefined1 local_1a;
  undefined1 local_19;
  
  if (*(undefined8 **)(in_RSI + 0x10) == (undefined8 *)0x0) {
    bVar2 = false;
  }
  else {
    iVar1 = (*(code *)**(undefined8 **)(in_RSI + 0x10))();
    bVar2 = iVar1 == 4;
  }
  if ((bVar2) || ((*(byte *)(in_RSI + 0x18) & 1) != 0)) {
LAB_00280498:
    *(undefined2 *)&(this->_value).v_.storage = 0;
  }
  else {
    if (*(undefined8 **)(in_RSI + 0x10) != (undefined8 *)0x0) {
      iVar1 = (*(code *)**(undefined8 **)(in_RSI + 0x10))();
      if (iVar1 == 0) goto LAB_00280498;
      if (*(undefined8 **)(in_RSI + 0x10) != (undefined8 *)0x0) {
        iVar1 = (*(code *)**(undefined8 **)(in_RSI + 0x10))();
        if (iVar1 == 1) goto LAB_00280498;
      }
    }
    tinyusdz::value::Value::get_value<bool>((Value *)&stack0xffffffffffffffe6,SUB81(in_RSI,0));
    *(undefined1 *)&(this->_value).v_.storage = local_1a;
    if (local_1a == '\x01') {
      *(undefined1 *)((long)&(this->_value).v_.storage + 1) = local_19;
    }
  }
  return SUB82(this,0);
}

Assistant:

nonstd::optional<T> get_value() const {

    if (is_blocked()) {
      return nonstd::nullopt;
    }

    if (!has_default()) {
      return nonstd::nullopt;
    }

    return _value.get_value<T>();
  }